

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O0

void prng_free(prng *pr)

{
  ulong local_20;
  size_t i;
  prng_impl *pi;
  prng *pr_local;
  
  smemclr(&pr[1].binarysink_[0].writefmtv,0x10);
  for (local_20 = 0; local_20 < 0x20; local_20 = local_20 + 1) {
    ssh_hash_free((ssh_hash *)(&pr[4].binarysink_[0].writefmtv)[local_20]);
  }
  if (pr[1].binarysink_[0].write != (_func_void_BinarySink_ptr_void_ptr_size_t *)0x0) {
    ssh_hash_free((ssh_hash *)pr[1].binarysink_[0].write);
  }
  if (pr[2].savesize != 0) {
    ssh_hash_free((ssh_hash *)pr[2].savesize);
  }
  smemclr(pr,0x1a8);
  safefree(pr);
  return;
}

Assistant:

void prng_free(prng *pr)
{
    prng_impl *pi = container_of(pr, prng_impl, Prng);

    smemclr(pi->counter, sizeof(pi->counter));
    for (size_t i = 0; i < NCOLLECTORS; i++)
        ssh_hash_free(pi->collectors[i]);
    if (pi->generator)
        ssh_hash_free(pi->generator);
    if (pi->keymaker)
        ssh_hash_free(pi->keymaker);
    smemclr(pi, sizeof(*pi));
    sfree(pi);
}